

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket.c
# Opt level: O3

ssize_t send_all(int fd,msghdr *msg,int flags)

{
  iovec *piVar1;
  uint uVar2;
  ssize_t sVar3;
  ulong uVar4;
  
  if (msg->msg_iovlen == 0) {
    sVar3 = 0;
  }
  else {
    piVar1 = msg->msg_iov;
    uVar2 = 1;
    uVar4 = 0;
    sVar3 = 0;
    do {
      memcpy(send_buffer + sVar3,piVar1[uVar4].iov_base,piVar1[uVar4].iov_len);
      piVar1 = msg->msg_iov;
      sVar3 = sVar3 + piVar1[uVar4].iov_len;
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar4 < msg->msg_iovlen);
  }
  return sVar3;
}

Assistant:

static ssize_t send_all(int fd, const struct msghdr *msg, int flags)
{
	(void)fd;
	(void)flags;
	ssize_t len = 0;
	for (unsigned int i = 0; i < msg->msg_iovlen; i++) {
		memcpy(&send_buffer[len], msg->msg_iov[i].iov_base, msg->msg_iov[i].iov_len);
		len += (ssize_t)msg->msg_iov[i].iov_len;
	}

	return len;
}